

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedModeFunction<unsigned_char,duckdb::ModeStandard<unsigned_char>>(LogicalType *type)

{
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *func;
  AggregateFunction *pAVar1;
  LogicalType local_48 [24];
  LogicalType local_30 [31];
  undefined1 local_11;
  AggregateFunction *input_type;
  
  local_11 = 0;
  pAVar1 = in_RDI;
  input_type = in_RDI;
  duckdb::LogicalType::LogicalType(local_30,in_RSI);
  duckdb::LogicalType::LogicalType(local_48,in_RSI);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<unsigned_char,duckdb::ModeStandard<unsigned_char>>,unsigned_char,unsigned_char,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_char>>,(duckdb::AggregateDestructorType)1>
            ((LogicalType *)input_type,in_RSI);
  duckdb::LogicalType::~LogicalType(local_48);
  duckdb::LogicalType::~LogicalType(local_30);
  in_RDI->window =
       ModeFunction<duckdb::ModeStandard<unsigned_char>>::
       Window<duckdb::ModeState<unsigned_char,duckdb::ModeStandard<unsigned_char>>,unsigned_char,unsigned_char>
  ;
  return pAVar1;
}

Assistant:

AggregateFunction GetTypedModeFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = ModeFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, type);
	func.window = OP::template Window<STATE, INPUT_TYPE, INPUT_TYPE>;
	return func;
}